

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O3

void __thiscall CoreML::Specification::BiasLayerParams::Clear(BiasLayerParams *this)

{
  InternalMetadata *this_00;
  WeightParams *this_01;
  ulong uVar1;
  undefined8 *puVar2;
  
  (this->shape_).current_size_ = 0;
  uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
  puVar2 = (undefined8 *)(uVar1 & 0xfffffffffffffffc);
  uVar1 = uVar1 & 1;
  if (uVar1 != 0) {
    puVar2 = (undefined8 *)*puVar2;
  }
  this_00 = &(this->super_MessageLite)._internal_metadata_;
  if ((puVar2 == (undefined8 *)0x0) && (this_01 = this->bias_, this_01 != (WeightParams *)0x0)) {
    WeightParams::~WeightParams(this_01);
    operator_delete(this_01,0x48);
    uVar1 = (ulong)((uint)this_00->ptr_ & 1);
  }
  this->bias_ = (WeightParams *)0x0;
  if (uVar1 != 0) {
    google::protobuf::internal::InternalMetadata::DoClear<std::__cxx11::string>(this_00);
    return;
  }
  return;
}

Assistant:

void BiasLayerParams::Clear() {
// @@protoc_insertion_point(message_clear_start:CoreML.Specification.BiasLayerParams)
  uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  shape_.Clear();
  if (GetArenaForAllocation() == nullptr && bias_ != nullptr) {
    delete bias_;
  }
  bias_ = nullptr;
  _internal_metadata_.Clear<std::string>();
}